

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O0

int __thiscall Centaurus::PriorityChain::compare(PriorityChain *this,PriorityChain *chain)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  const_reference this_00;
  const_reference e;
  PriorityChainElement *q;
  PriorityChainElement *p;
  size_type local_30;
  int local_24;
  vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
  *pvStack_20;
  int i;
  PriorityChain *chain_local;
  PriorityChain *this_local;
  
  local_24 = 0;
  pvStack_20 = &chain->
                super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
  ;
  chain_local = this;
  while( true ) {
    uVar2 = (ulong)local_24;
    local_30 = std::
               vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               ::size(&this->
                       super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                     );
    p = (PriorityChainElement *)
        std::
        vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
        size(pvStack_20);
    puVar3 = std::min<unsigned_long>(&local_30,(unsigned_long *)&p);
    if (*puVar3 <= uVar2) {
      return 0;
    }
    this_00 = std::
              vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
              ::operator[](&this->
                            super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                           ,(long)local_24);
    e = std::
        vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
        operator[](pvStack_20,(long)local_24);
    bVar1 = PriorityChainElement::operator<(this_00,e);
    if (bVar1) break;
    bVar1 = PriorityChainElement::operator>(this_00,e);
    if (bVar1) {
      return 1;
    }
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int compare(const PriorityChain& chain) const
    {
        for (int i = 0; i < std::min(size(), chain.size()); i++)
        {
            const PriorityChainElement& p = this->operator[](i);
            const PriorityChainElement& q = chain[i];

            if (p < q) return -1;
            if (p > q) return +1;
        }
        return 0;
    }